

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

Vec_Wec_t * Gia_ManFxRetrieve(Gia_Man_t *p,Vec_Str_t **pvCompl,int fReverse)

{
  uint nVars;
  Gia_Obj_t *pGVar1;
  int *piVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int nCutSize;
  uint uVar7;
  int iVar8;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *vMemory;
  int *piVar9;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar10;
  Vec_Str_t *pVVar11;
  char *__s;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  
  iVar6 = Gia_ManAssignNumbers(p);
  nCutSize = Gia_ManLutSizeMax(p);
  __ptr = Gia_ManComputeTruths(p,nCutSize,iVar6 - p->vCis->nSize,fReverse);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar9 = (int *)malloc(0x40000);
  vMemory->pArray = piVar9;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pVVar10 = (Vec_Int_t *)calloc(1000,0x10);
  p_00->pArray = pVVar10;
  pVVar11 = (Vec_Str_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar13 = iVar6;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar13;
  if (iVar13 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar13);
  }
  bVar4 = (char)nCutSize - 6;
  pVVar11->pArray = __s;
  pVVar11->nSize = iVar6;
  memset(__s,0,(long)iVar6);
  *pvCompl = pVVar11;
  iVar13 = 0;
  if (1 < p->nObjs) {
    iVar13 = 0;
    bVar5 = bVar4;
    if (nCutSize < 7) {
      bVar5 = 0;
    }
    lVar14 = 1;
    do {
      iVar6 = p->vMapping->nSize;
      if (iVar6 <= lVar14) {
LAB_0073d924:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar9 = p->vMapping->pArray;
      uVar7 = piVar9[lVar14];
      uVar16 = (ulong)uVar7;
      if (uVar16 != 0) {
        if (((int)uVar7 < 0) || (iVar6 <= (int)uVar7)) goto LAB_0073d924;
        uVar7 = iVar13 << (bVar5 & 0x1f);
        if ((iVar13 << (bVar5 & 0x1f) < 0) || (__ptr->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pGVar1 = p->pObjs;
        nVars = piVar9[uVar16];
        iVar13 = iVar13 + 1;
        iVar8 = Kit_TruthIsop((uint *)(__ptr->pArray + uVar7),nVars,vMemory,1);
        iVar6 = vMemory->nSize;
        if ((iVar6 == 0) || ((iVar6 == 1 && (*vMemory->pArray == 0)))) {
          uVar7 = pGVar1[lVar14].Value;
          if (((long)(int)uVar7 < 0) || ((*pvCompl)->nSize <= (int)uVar7)) goto LAB_0073d962;
          (*pvCompl)->pArray[(int)uVar7] = iVar6 == 0;
          pVVar10 = Vec_WecPushLevel(p_00);
          Vec_IntPush(pVVar10,pGVar1[lVar14].Value);
        }
        else {
          uVar7 = pGVar1[lVar14].Value;
          if (((long)(int)uVar7 < 0) || ((*pvCompl)->nSize <= (int)uVar7)) {
LAB_0073d962:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          (*pvCompl)->pArray[(int)uVar7] = (char)iVar8;
          if (0 < vMemory->nSize) {
            lVar3 = uVar16 * 4 + 4;
            lVar12 = 0;
            do {
              iVar6 = vMemory->pArray[lVar12];
              pVVar10 = Vec_WecPushLevel(p_00);
              Vec_IntPush(pVVar10,pGVar1[lVar14].Value);
              if (0 < (int)nVars) {
                lVar19 = 0;
                do {
                  switch(iVar6 >> ((byte)lVar19 & 0x1f) & 3) {
                  case 0:
                    goto switchD_0073d6f6_caseD_0;
                  case 1:
                    iVar8 = *(int *)((long)piVar9 + lVar19 * 2 + lVar3);
                    if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_0073d8c7:
                      __assert_fail("v >= 0 && v < p->nObjs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                    }
                    uVar7 = p->pObjs[iVar8].Value;
                    if ((int)uVar7 < 0) {
LAB_0073d8e6:
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                    ,0x12e,"int Abc_Var2Lit(int, int)");
                    }
                    iVar8 = uVar7 * 2 + 1;
                    break;
                  case 2:
                    iVar8 = *(int *)((long)piVar9 + lVar19 * 2 + lVar3);
                    if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0073d8c7;
                    uVar7 = p->pObjs[iVar8].Value;
                    if ((int)uVar7 < 0) goto LAB_0073d8e6;
                    iVar8 = uVar7 * 2;
                    break;
                  case 3:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                                  ,0xea,
                                  "Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
                  }
                  Vec_IntPush(pVVar10,iVar8);
switchD_0073d6f6_caseD_0:
                  lVar19 = lVar19 + 2;
                } while ((ulong)nVars * 2 != lVar19);
              }
              iVar6 = pVVar10->nSize;
              if (2 < iVar6) {
                piVar2 = pVVar10->pArray;
                uVar15 = 1;
                uVar16 = 0;
                do {
                  uVar18 = uVar16 & 0xffffffff;
                  uVar17 = uVar15;
                  do {
                    uVar7 = (uint)uVar17;
                    if (piVar2[(long)(int)(uint)uVar18 + 1] <= piVar2[uVar17 + 1]) {
                      uVar7 = (uint)uVar18;
                    }
                    uVar17 = uVar17 + 1;
                    uVar18 = (ulong)uVar7;
                  } while (iVar6 - 1 != uVar17);
                  iVar8 = piVar2[uVar16 + 1];
                  piVar2[uVar16 + 1] = piVar2[(long)(int)uVar7 + 1];
                  uVar16 = uVar16 + 1;
                  piVar2[(long)(int)uVar7 + 1] = iVar8;
                  uVar15 = uVar15 + 1;
                } while (uVar16 != iVar6 - 2);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < vMemory->nSize);
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nObjs);
  }
  if (nCutSize < 7) {
    bVar4 = 0;
  }
  if (iVar13 << (bVar4 & 0x1f) != __ptr->nSize) {
    __assert_fail("Counter * nWords == Vec_WrdSize(vTruths)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                  ,0xef,"Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
    vMemory->pArray = (int *)0x0;
  }
  free(vMemory);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManFxRetrieve( Gia_Man_t * p, Vec_Str_t ** pvCompl, int fReverse )
{
    Vec_Wec_t * vCubes;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vCube, * vCover;
    int nItems, nCutSize, nWords;
    int i, c, v, Lit, Cube, Counter = 0;
//    abctime clk = Abc_Clock();
    nItems = Gia_ManAssignNumbers( p );
    // compute truth tables
    nCutSize = Gia_ManLutSizeMax( p );
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Gia_ManComputeTruths( p, nCutSize, nItems - Gia_ManCiNum(p), fReverse );
    vCover = Vec_IntAlloc( 1 << 16 );
    // collect cubes
    vCubes = Vec_WecAlloc( 1000 );
    *pvCompl = Vec_StrStart( nItems );
    Gia_ManForEachLut( p, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, i );
        int nVars = Gia_ObjLutSize( p, i );
        int * pVars = Gia_ObjLutFanins( p, i );
        word * pTruth = Vec_WrdEntryP( vTruths, Counter++ * nWords );
        int Status = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
        {
            Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)(Vec_IntSize(vCover) == 0) );
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            continue;
        }
        Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)Status );
        Vec_IntForEachEntry( vCover, Cube, c )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            for ( v = 0; v < nVars; v++ )
            {
                Lit = 3 & (Cube >> (v << 1));
                if ( Lit == 1 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 1) );
                else if ( Lit == 2 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 0) );
                else if ( Lit != 0 )
                    assert( 0 );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }        
    }
    assert( Counter * nWords == Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    Vec_IntFree( vCover );
//    Abc_PrintTime( 1, "Setup time", Abc_Clock() - clk );
    return vCubes;
}